

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O2

int Lodtalk::Float::stPrintString(InterpreterProxy *interpreter)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t size;
  ByteString *pBVar3;
  allocator local_a1;
  Oop self;
  char buffer [128];
  
  iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar2) != 0) {
    iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    return iVar2;
  }
  self.field_0._0_4_ = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
  self.field_0.uintValue._4_4_ = extraout_var_00;
  bVar1 = Oop::isFloat(&self);
  if (!bVar1) {
    std::__cxx11::string::string((string *)buffer,"expected a small integer.",&local_a1);
    nativeError((string *)buffer);
    std::__cxx11::string::~string((string *)buffer);
  }
  Oop::decodeFloat(&self);
  snprintf(buffer,0x7f,"%f");
  iVar2 = (**interpreter->_vptr_InterpreterProxy)(interpreter);
  size = strlen(buffer);
  pBVar3 = ByteString::fromNativeRange((VMContext *)CONCAT44(extraout_var_01,iVar2),buffer,size);
  iVar2 = (*interpreter->_vptr_InterpreterProxy[0x17])(interpreter,pBVar3);
  return iVar2;
}

Assistant:

int Float::stPrintString(InterpreterProxy *interpreter)
{
    if(interpreter->getArgumentCount() != 0)
        return interpreter->primitiveFailed();

    auto self = interpreter->getReceiver();
    if(!self.isFloat())
        nativeError("expected a small integer.");

    char buffer[128];
    snprintf(buffer, 127, "%f", self.decodeFloat());

    auto result = Oop::fromPointer(ByteString::fromNativeRange(interpreter->getContext(), buffer, strlen(buffer)));
    return interpreter->returnOop(result);
}